

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::IsTraceEnabled(BackwardPass *this)

{
  Phase phase;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  phase = this->tag;
  uVar3 = Func::GetSourceContextId(this->func);
  uVar4 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,phase,uVar3,uVar4);
  if (bVar1) {
    uVar3 = Func::GetSourceContextId(this->func);
    uVar4 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,SimpleJitPhase,uVar3,uVar4);
    bVar1 = true;
    if (!bVar2) {
      bVar1 = Func::IsSimpleJit(this->func);
      bVar1 = !bVar1;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
BackwardPass::IsTraceEnabled() const
{
    return
        Js::Configuration::Global.flags.Trace.IsEnabled(tag, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()) &&
        (PHASE_TRACE(Js::SimpleJitPhase, func) || !func->IsSimpleJit());
}